

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O2

void __thiscall embree::SceneGraph::GroupNode::print(GroupNode *this,ostream *cout,int depth)

{
  Node *pNVar1;
  ostream *poVar2;
  uint n;
  size_t i;
  ulong uVar3;
  
  poVar2 = std::operator<<(cout,"GroupNode @ ");
  poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
  poVar2 = std::operator<<(poVar2," { ");
  std::endl<char,std::char_traits<char>>(poVar2);
  n = depth + 1;
  tab(cout,n);
  poVar2 = std::operator<<(cout,"closed = ");
  poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
  std::endl<char,std::char_traits<char>>(poVar2);
  for (uVar3 = 0;
      uVar3 < (ulong)((long)(this->children).
                            super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->children).
                            super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3); uVar3 = uVar3 + 1) {
    tab(cout,n);
    poVar2 = std::operator<<(cout,"child");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2," = ");
    pNVar1 = (this->children).
             super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar3].ptr;
    (*(pNVar1->super_RefCount)._vptr_RefCount[4])(pNVar1,cout,(ulong)n);
  }
  tab(cout,depth);
  poVar2 = std::operator<<(cout,"}");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void SceneGraph::GroupNode::print(std::ostream& cout, int depth)
  {
    cout << "GroupNode @ " << this << " { " << std::endl;
    tab(cout, depth+1); cout << "closed = " << closed << std::endl;
    for (size_t i=0; i<children.size(); i++) {
      tab(cout, depth+1); cout << "child" << i << " = "; children[i]->print(cout,depth+1);
    }
    tab(cout, depth); cout << "}" << std::endl;
  }